

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O0

bool __thiscall
ON_SubDComponentRefList::Internal_UpdateCount
          (ON_SubDComponentRefList *this,ON_SubDComponentRef *r,int i)

{
  bool bVar1;
  Type TVar2;
  ON_SubD *this_00;
  ON_SubDVertex *pOVar3;
  ON_SubDEdge *pOVar4;
  ON_SubDFace *pOVar5;
  ON_SubDEdge *e;
  ON_SubDVertex *v;
  ON_SubDComponentPtr cptr;
  bool rc;
  int i_local;
  ON_SubDComponentRef *r_local;
  ON_SubDComponentRefList *this_local;
  
  cptr.m_ptr._4_4_ = i;
  this_00 = ON_SubDComponentRef::SubD(r);
  bVar1 = ON_SubD::IsEmpty(this_00);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    cptr.m_ptr._3_1_ = 0;
    v = (ON_SubDVertex *)ON_SubDComponentRef::ComponentPtr(r);
    TVar2 = ON_SubDComponentPtr::ComponentType((ON_SubDComponentPtr *)&v);
    switch(TVar2) {
    case Unset:
      break;
    case Vertex:
      pOVar3 = ON_SubDComponentPtr::Vertex((ON_SubDComponentPtr *)&v);
      if (pOVar3 != (ON_SubDVertex *)0x0) {
        switch(pOVar3->m_vertex_tag) {
        case Unset:
          break;
        case Smooth:
          this->m_subd_vertex_smooth_count = cptr.m_ptr._4_4_ + this->m_subd_vertex_smooth_count;
          cptr.m_ptr._3_1_ = 1;
          break;
        case Crease:
          this->m_subd_vertex_crease_count = cptr.m_ptr._4_4_ + this->m_subd_vertex_crease_count;
          cptr.m_ptr._3_1_ = 1;
          break;
        case Corner:
          this->m_subd_vertex_corner_count = cptr.m_ptr._4_4_ + this->m_subd_vertex_corner_count;
          cptr.m_ptr._3_1_ = 1;
          break;
        case Dart:
          this->m_subd_vertex_dart_count = cptr.m_ptr._4_4_ + this->m_subd_vertex_dart_count;
          cptr.m_ptr._3_1_ = 1;
        }
      }
      break;
    case Edge:
      pOVar4 = ON_SubDComponentPtr::Edge((ON_SubDComponentPtr *)&v);
      if (pOVar4 != (ON_SubDEdge *)0x0) {
        switch(pOVar4->m_edge_tag) {
        case Unset:
          break;
        case Smooth:
        case SmoothX:
          this->m_subd_edge_smooth_count = cptr.m_ptr._4_4_ + this->m_subd_edge_smooth_count;
          cptr.m_ptr._3_1_ = 1;
          break;
        case Crease:
          this->m_subd_edge_crease_count = cptr.m_ptr._4_4_ + this->m_subd_edge_crease_count;
          cptr.m_ptr._3_1_ = 1;
        }
      }
      break;
    case Face:
      pOVar5 = ON_SubDComponentPtr::Face((ON_SubDComponentPtr *)&v);
      if (pOVar5 != (ON_SubDFace *)0x0) {
        this->m_subd_face_count = cptr.m_ptr._4_4_ + this->m_subd_face_count;
        cptr.m_ptr._3_1_ = 1;
      }
    }
    this_local._7_1_ = (bool)(cptr.m_ptr._3_1_ & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDComponentRefList::Internal_UpdateCount(const ON_SubDComponentRef& r, int i)
{
  if (r.SubD().IsEmpty())
    return false;

  bool rc = false;
  ON_SubDComponentPtr cptr = r.ComponentPtr();
  switch (cptr.ComponentType())
  {
      case ON_SubDComponentPtr::Type::Unset:
        break;
          
      case ON_SubDComponentPtr::Type::Vertex:
    {
      const ON_SubDVertex* v = cptr.Vertex();
      if (nullptr == v)
        break;
      switch (v->m_vertex_tag)
      {
      case ON_SubDVertexTag::Smooth:
        m_subd_vertex_smooth_count += i;
        rc = true;
        break;
      case ON_SubDVertexTag::Crease:
        m_subd_vertex_crease_count += i;
        rc = true;
        break;
      case ON_SubDVertexTag::Corner:
        m_subd_vertex_corner_count += i;
        rc = true;
        break;
      case ON_SubDVertexTag::Dart:
        m_subd_vertex_dart_count += i;
        rc = true;
        break;
      case ON_SubDVertexTag::Unset:
        break;
      }
    }
    break;

  case ON_SubDComponentPtr::Type::Edge:
    {
      const ON_SubDEdge* e = cptr.Edge();
      if (nullptr == e)
        break;
      switch (e->m_edge_tag)
      {
      case ON_SubDEdgeTag::Smooth:
      case ON_SubDEdgeTag::SmoothX:
        m_subd_edge_smooth_count += i;
        rc = true;
        break;
      case ON_SubDEdgeTag::Crease:
        m_subd_edge_crease_count += i;
        rc = true;
        break;
      case ON_SubDEdgeTag::Unset:
        break;
      }
    }
    break;

  case ON_SubDComponentPtr::Type::Face:
    if (nullptr != cptr.Face())
    {
      m_subd_face_count += i;
      rc = true;
    }
    break;
  }

  return rc;
}